

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmLocalUnixMakefileGenerator3::ConvertToFullPath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *localPath)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_60 [32];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  undefined1 *local_28;
  size_type local_20;
  pointer local_18;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_40._M_str = (psVar1->_M_dataplus)._M_p;
  local_40._M_len = psVar1->_M_string_length;
  local_28 = local_60;
  local_60[0] = 0x2f;
  local_30 = 1;
  local_18 = (localPath->_M_dataplus)._M_p;
  local_20 = localPath->_M_string_length;
  views._M_len = 3;
  views._M_array = &local_40;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::ConvertToFullPath(
  const std::string& localPath)
{
  std::string dir =
    cmStrCat(this->GetCurrentBinaryDirectory(), '/', localPath);
  return dir;
}